

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
pstore::json::details::number_matcher<pstore::exchange::import_ns::callbacks>::do_frac_digit_state
          (number_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char c)

{
  uint uVar1;
  error_code local_20;
  
  uVar1 = (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_;
  if ((uVar1 & 0xfffffffe) != 6) {
    assert_failed("this->get_state () == frac_initial_digit_state || this->get_state () == frac_digit_state"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x272);
  }
  if ((c & 0xdfU) == 0x45) {
    if ((this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xd == '\x01') {
      (this->fp_acc_).whole_part =
           ((double)CONCAT44(0x45300000,(int)(this->int_acc_ >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)this->int_acc_) - 4503599627370496.0);
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xd = 0;
    }
    if (uVar1 != 6) {
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 8;
      return true;
    }
  }
  else {
    if ((byte)(c - 0x30U) < 10) {
      if ((this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xd == '\x01') {
        (this->fp_acc_).whole_part =
             ((double)CONCAT44(0x45300000,(int)(this->int_acc_ >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->int_acc_) - 4503599627370496.0);
        (this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xd = 0;
      }
      (this->fp_acc_).frac_part = (this->fp_acc_).frac_part * 10.0 + (double)(int)(char)(c - 0x30U);
      (this->fp_acc_).frac_scale = (this->fp_acc_).frac_scale * 10.0;
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 7;
      return true;
    }
    if (uVar1 != 6) {
      complete(this,parser);
      return false;
    }
  }
  local_20._M_cat = get_error_category();
  local_20._M_value = 0xb;
  matcher<pstore::exchange::import_ns::callbacks>::set_error
            (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser,&local_20);
  return true;
}

Assistant:

void set_state (int const s) noexcept { state_ = s; }